

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.hpp
# Opt level: O2

void __thiscall curlpp::FormPart::FormPart(FormPart *this,FormPart *param_1)

{
  this->_vptr_FormPart = (_func_int **)&PTR__FormPart_00134b80;
  std::__cxx11::string::string((string *)&this->mName,(string *)&param_1->mName);
  return;
}

Assistant:

class CURLPPAPI FormPart
	{
		friend class HttpPost;

	public:

		/**
		* initialize the FormPart. "name" is the name of the field.
		*/
		FormPart(const char * name);

		/**
		* initialize the FormPart. "name" is the name of the field.
		*/
		FormPart(const std::string & name);

		virtual ~FormPart();

		virtual FormPart * clone() const = 0;

	protected:

		/**
		* it will add himself to the curl_httppost * first.
		*/
		virtual void add(::curl_httppost ** first, 
			::curl_httppost ** last) = 0;

		/**
		* Contain the name of the field.
		*/
		const std::string mName;

	}